

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,
                  Negation<int> *ext,SetKey<int,_Negation<int>_> *set,
                  Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  Hasher *in_RCX;
  long in_RSI;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *in_RDI;
  Negation<int> *in_R8;
  SetKey<int,_Negation<int>_> *in_R9;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *unaff_retaddr;
  size_type in_stack_00000008;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000010;
  hasher *in_stack_ffffffffffffff78;
  Settings *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  
  Settings::Settings(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo((KeyInfo *)(in_RDI + 1),in_R8,in_R9,in_RCX);
  in_RDI[1].enlarge_threshold_ = 0;
  if (in_RSI != 0) {
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffb8);
  bucket_count((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xa155e8);
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            (in_RDI,(size_type)in_stack_ffffffffffffff78);
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }